

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToLocalWideUnicode::map_utf8
          (CCharmapToLocalWideUnicode *this,char *dest,size_t dest_len,utf8_ptr src,
          size_t src_byte_len,size_t *src_bytes_used)

{
  wchar_t wVar1;
  utf8_ptr p;
  wchar_t *pwVar2;
  size_t sVar3;
  
  sVar3 = 0;
  pwVar2 = (wchar_t *)dest;
  for (p.p_ = src.p_; p.p_ < src.p_ + src_byte_len; p.p_ = utf8_ptr::s_inc(p.p_)) {
    if (dest != (char *)0x0) {
      if (dest_len < 4) break;
      wVar1 = utf8_ptr::s_getch(p.p_);
      *pwVar2 = wVar1;
      pwVar2 = pwVar2 + 1;
      dest_len = dest_len - 4;
    }
    sVar3 = sVar3 + 4;
  }
  if (src_bytes_used != (size_t *)0x0) {
    *src_bytes_used = (long)p.p_ - (long)src.p_;
  }
  return sVar3;
}

Assistant:

size_t CCharmapToLocalWideUnicode::
   map_utf8(char *dest, size_t dest_len,
            utf8_ptr src, size_t src_byte_len,
            size_t *src_bytes_used) const
{
    utf8_ptr src_start;
    size_t cur_total;
    char *srcend;
    wchar_t *destw;

    /* remember where we started */
    src_start = src;

    /* compute where the source buffer ends */
    srcend = src.getptr() + src_byte_len;

    /* set up a wchar_t output pointer for convenience */
    destw = (wchar_t *)dest;

    /* copy characters until we reach the end of the source string */
    for (cur_total = 0 ; src.getptr() < srcend ; src.inc())
    {
        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest == 0)
        {
            /* we're just counting - don't store anything */
        }
        else if (dest_len >= sizeof(wchar_t))
        {
            /* add the sequence */
            *destw++ = src.getch();

            /* adjust the length remaining */
            dest_len -= sizeof(wchar_t);
        }
        else
        {
            /* it doesn't fit - stop now */
            break;
        }

        /* count the length in the total */
        cur_total += sizeof(wchar_t);
    }

    /* if the caller wants to know how much space we used, tell them */
    if (src_bytes_used != 0)
        *src_bytes_used = src.getptr() - src_start.getptr();

    /* return the total length of the result */
    return cur_total;
}